

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

Am_Object * __thiscall Am_Object::operator=(Am_Object *this,Am_Object *prev)

{
  uint *puVar1;
  Am_Object_Data *pAVar2;
  Am_Object_Data *pAVar3;
  
  pAVar2 = this->data;
  pAVar3 = prev->data;
  this->data = pAVar3;
  if (pAVar3 != (Am_Object_Data *)0x0) {
    puVar1 = &(pAVar3->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 + 1;
  }
  if (pAVar2 != (Am_Object_Data *)0x0) {
    puVar1 = &(pAVar2->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      (*(pAVar2->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[4])();
    }
  }
  return this;
}

Assistant:

Am_Object &
Am_Object::operator=(const Am_Object &prev)
{
  Am_Object_Data *old_data = data;
  data = prev.data;
  if (data)
    data->Note_Reference();
  if (old_data)
    old_data->Release();
  return *this;
}